

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O0

void emit_lib(BuildCtx *ctx)

{
  char **ppcVar1;
  bool bVar2;
  FILE *__stream;
  int iVar3;
  BuildCtx *ctx_00;
  int *piVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  BuildCtx *in_RDI;
  char *p_1;
  int i;
  size_t len;
  size_t n;
  LibDefHandler *ldh;
  int lvl;
  int ok;
  char *p;
  FILE *fp;
  char buf [256];
  char *fname;
  size_t local_170;
  uint8_t *local_158;
  int local_14c;
  LibDefHandler *local_138;
  int local_130;
  char *local_128;
  char local_118;
  char local_117;
  char local_116;
  char *local_10;
  BuildCtx *local_8;
  
  local_8 = in_RDI;
  if (((in_RDI->mode == BUILD_ffdef) || (in_RDI->mode == BUILD_libdef)) ||
     (in_RDI->mode == BUILD_recdef)) {
    fprintf((FILE *)in_RDI->fp,"/* This is a generated file. DO NOT EDIT! */\n\n");
  }
  else if (in_RDI->mode == BUILD_vmdef) {
    fprintf((FILE *)in_RDI->fp,"ffnames = {\n[0]=\"Lua\",\n\"C\",\n");
  }
  if (local_8->mode == BUILD_recdef) {
    fprintf((FILE *)local_8->fp,"static const uint16_t recff_idmap[] = {\n0,\n0x0100");
  }
  ffid = 2;
  recffid = 2;
  ffasmfunc = 0;
  do {
    ppcVar1 = local_8->args;
    local_8->args = ppcVar1 + 1;
    local_10 = *ppcVar1;
    if (local_10 == (char *)0x0) {
      if (local_8->mode == BUILD_ffdef) {
        fprintf((FILE *)local_8->fp,"\n#undef FFDEF\n\n");
        fprintf((FILE *)local_8->fp,"#ifndef FF_NUM_ASMFUNC\n#define FF_NUM_ASMFUNC %d\n#endif\n\n",
                (ulong)(uint)ffasmfunc);
      }
      else if (local_8->mode == BUILD_vmdef) {
        fprintf((FILE *)local_8->fp,"},\n\n");
      }
      else if (local_8->mode == BUILD_bcdef) {
        fprintf((FILE *)local_8->fp,"\n};\n\n");
        fprintf((FILE *)local_8->fp,"LJ_DATADEF const uint16_t lj_bc_mode[] = {\n");
        fprintf((FILE *)local_8->fp,"BCDEF(BCMODE)\n");
        local_14c = ffasmfunc;
        while (local_14c = local_14c + -1, 0 < local_14c) {
          fprintf((FILE *)local_8->fp,"BCMODE_FF,\n");
        }
        fprintf((FILE *)local_8->fp,"BCMODE_FF\n};\n\n");
      }
      else if (local_8->mode == BUILD_recdef) {
        local_158 = obuf;
        fprintf((FILE *)local_8->fp,"\n};\n\n");
        fprintf((FILE *)local_8->fp,"static const RecordFunc recff_func[] = {\nrecff_nyi,\nrecff_c")
        ;
        for (; *local_158 != '\0'; local_158 = local_158 + sVar7 + 1) {
          fprintf((FILE *)local_8->fp,",\nrecff_%s",local_158);
          sVar7 = strlen((char *)local_158);
        }
        fprintf((FILE *)local_8->fp,"\n};\n\n");
      }
      return;
    }
    if (((*local_10 != '-') || (ctx_00 = _stdin, local_10[1] != '\0')) &&
       (ctx_00 = (BuildCtx *)fopen64(local_10,"r"), pcVar6 = local_10, __stream = _stderr,
       ctx_00 == (BuildCtx *)0x0)) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      fprintf(__stream,"Error: cannot open input file \'%s\': %s\n",pcVar6,pcVar5);
      exit(1);
    }
    modstate = 0;
    regfunc = 0;
LAB_0010e7c7:
    pcVar6 = fgets(&local_118,0x100,(FILE *)ctx_00);
    if (pcVar6 != (char *)0x0) {
      if (((local_118 == '#') && (local_117 == 'i')) && (local_116 == 'f')) {
        iVar3 = strcmp(&local_118,"#if LJ_52\n");
        if (iVar3 == 0) {
          bVar2 = false;
        }
        else {
          iVar3 = strcmp(&local_118,"#if LJ_HASJIT\n");
          if (iVar3 != 0) {
            strcmp(&local_118,"#if LJ_HASFFI\n");
          }
          bVar2 = true;
        }
        if (bVar2) goto LAB_0010e90c;
        local_130 = 1;
        do {
          while( true ) {
            pcVar6 = fgets(&local_118,0x100,(FILE *)ctx_00);
            if (pcVar6 == (char *)0x0) goto LAB_0010e7c7;
            if (((local_118 == '#') && (local_117 == 'e')) && (local_116 == 'n')) break;
            if (((local_118 == '#') && (local_117 == 'i')) && (local_116 == 'f')) {
              local_130 = local_130 + 1;
            }
          }
          local_130 = local_130 + -1;
        } while (local_130 != 0);
      }
      else {
LAB_0010e90c:
        local_128 = &local_118;
        while (local_128 = strstr(local_128,"LJLIB_"), local_128 != (char *)0x0) {
          local_128 = local_128 + 6;
          for (local_138 = libdef_handlers; local_138->suffix != (char *)0x0;
              local_138 = local_138 + 1) {
            sVar7 = strlen(local_138->suffix);
            iVar3 = strncmp(local_128,local_138->suffix,sVar7);
            if (iVar3 == 0) {
              local_128 = local_128 + sVar7;
              if (local_138->stop == (char *)0x0) {
                local_170 = 0;
              }
              else {
                local_170 = strcspn(local_128,local_138->stop);
              }
              if (local_128[local_170] != '\0') {
                local_128[local_170] = '\0';
                (*local_138->func)(local_8,local_128,local_138->arg);
                local_128 = local_128 + local_170 + 1;
              }
              break;
            }
          }
          if (local_138->suffix == (char *)0x0) {
            sVar7 = strlen(&local_118);
            (&stack0xfffffffffffffee7)[sVar7] = 0;
            fprintf(_stderr,"Error: unknown library definition tag %s%s\n","LJLIB_",local_128);
            exit(1);
          }
        }
      }
      goto LAB_0010e7c7;
    }
    fclose((FILE *)ctx_00);
    if (local_8->mode == BUILD_libdef) {
      libdef_endmodule(ctx_00);
    }
  } while( true );
}

Assistant:

void emit_lib(BuildCtx *ctx)
{
  const char *fname;

  if (ctx->mode == BUILD_ffdef || ctx->mode == BUILD_libdef ||
      ctx->mode == BUILD_recdef)
    fprintf(ctx->fp, "/* This is a generated file. DO NOT EDIT! */\n\n");
  else if (ctx->mode == BUILD_vmdef)
    fprintf(ctx->fp, "ffnames = {\n[0]=\"Lua\",\n\"C\",\n");
  if (ctx->mode == BUILD_recdef)
    fprintf(ctx->fp, "static const uint16_t recff_idmap[] = {\n0,\n0x0100");
  recffid = ffid = FF_C+1;
  ffasmfunc = 0;

  while ((fname = *ctx->args++)) {
    char buf[256];  /* We don't care about analyzing lines longer than that. */
    FILE *fp;
    if (fname[0] == '-' && fname[1] == '\0') {
      fp = stdin;
    } else {
      fp = fopen(fname, "r");
      if (!fp) {
	fprintf(stderr, "Error: cannot open input file '%s': %s\n",
		fname, strerror(errno));
	exit(1);
      }
    }
    modstate = 0;
    regfunc = REGFUNC_OK;
    while (fgets(buf, sizeof(buf), fp) != NULL) {
      char *p;
      /* Simplistic pre-processor. Only handles top-level #if/#endif. */
      if (buf[0] == '#' && buf[1] == 'i' && buf[2] == 'f') {
	int ok = 1;
	if (!strcmp(buf, "#if LJ_52\n"))
	  ok = LJ_52;
	else if (!strcmp(buf, "#if LJ_HASJIT\n"))
	  ok = LJ_HASJIT;
	else if (!strcmp(buf, "#if LJ_HASFFI\n"))
	  ok = LJ_HASFFI;
	if (!ok) {
	  int lvl = 1;
	  while (fgets(buf, sizeof(buf), fp) != NULL) {
	    if (buf[0] == '#' && buf[1] == 'e' && buf[2] == 'n') {
	      if (--lvl == 0) break;
	    } else if (buf[0] == '#' && buf[1] == 'i' && buf[2] == 'f') {
	      lvl++;
	    }
	  }
	  continue;
	}
      }
      for (p = buf; (p = strstr(p, LIBDEF_PREFIX)) != NULL; ) {
	const LibDefHandler *ldh;
	p += sizeof(LIBDEF_PREFIX)-1;
	for (ldh = libdef_handlers; ldh->suffix != NULL; ldh++) {
	  size_t n, len = strlen(ldh->suffix);
	  if (!strncmp(p, ldh->suffix, len)) {
	    p += len;
	    n = ldh->stop ? strcspn(p, ldh->stop) : 0;
	    if (!p[n]) break;
	    p[n] = '\0';
	    ldh->func(ctx, p, ldh->arg);
	    p += n+1;
	    break;
	  }
	}
	if (ldh->suffix == NULL) {
	  buf[strlen(buf)-1] = '\0';
	  fprintf(stderr, "Error: unknown library definition tag %s%s\n",
		  LIBDEF_PREFIX, p);
	  exit(1);
	}
      }
    }
    fclose(fp);
    if (ctx->mode == BUILD_libdef) {
      libdef_endmodule(ctx);
    }
  }

  if (ctx->mode == BUILD_ffdef) {
    fprintf(ctx->fp, "\n#undef FFDEF\n\n");
    fprintf(ctx->fp,
      "#ifndef FF_NUM_ASMFUNC\n#define FF_NUM_ASMFUNC %d\n#endif\n\n",
      ffasmfunc);
  } else if (ctx->mode == BUILD_vmdef) {
    fprintf(ctx->fp, "},\n\n");
  } else if (ctx->mode == BUILD_bcdef) {
    int i;
    fprintf(ctx->fp, "\n};\n\n");
    fprintf(ctx->fp, "LJ_DATADEF const uint16_t lj_bc_mode[] = {\n");
    fprintf(ctx->fp, "BCDEF(BCMODE)\n");
    for (i = ffasmfunc-1; i > 0; i--)
      fprintf(ctx->fp, "BCMODE_FF,\n");
    fprintf(ctx->fp, "BCMODE_FF\n};\n\n");
  } else if (ctx->mode == BUILD_recdef) {
    char *p = (char *)obuf;
    fprintf(ctx->fp, "\n};\n\n");
    fprintf(ctx->fp, "static const RecordFunc recff_func[] = {\n"
	    "recff_nyi,\n"
	    "recff_c");
    while (*p) {
      fprintf(ctx->fp, ",\nrecff_%s", p);
      p += strlen(p)+1;
    }
    fprintf(ctx->fp, "\n};\n\n");
  }
}